

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseSnapshot.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
DatabaseSnapshot::find_compact_candidate_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,DatabaseSnapshot *this,bool smart)

{
  OnDiskDataset *pOVar1;
  OnDiskDataset *pOVar2;
  ulong uVar3;
  source_loc loc;
  source_loc loc_00;
  iterator iVar4;
  pointer ppOVar5;
  pointer ppOVar6;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *pvVar7;
  OnDiskDataset **ppOVar8;
  bool bVar9;
  OnDiskDataset **candidate;
  uint64_t uVar10;
  uint64_t uVar11;
  ulong uVar12;
  long lVar13;
  logger *plVar14;
  undefined7 in_register_00000011;
  ulong uVar15;
  OnDiskDataset **ppOVar16;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_00;
  pointer datasets;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  OnDiskDataset **ppOVar18;
  __normal_iterator<const_OnDiskDataset_**,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
  __i;
  long lVar19;
  string_view_t fmt;
  string_view dataset_id;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> ready_candidates;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *names;
  int64_t best_compact_value;
  OnDiskDataset **local_108;
  OnDiskDataset **local_100;
  OnDiskDataset **local_f8;
  iterator iStack_f0;
  OnDiskDataset **local_e8;
  ConfigKey local_d8;
  OnDiskDataset **local_a0;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> local_98;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_78;
  long local_70;
  undefined4 local_64;
  vector<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>
  local_60;
  uint64_t local_48;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *local_40;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *local_38;
  
  local_64 = (undefined4)CONCAT71(in_register_00000011,smart);
  local_78 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__;
  ConfigKey::merge_max_datasets();
  uVar10 = DatabaseConfig::get(&this->config,&local_d8);
  paVar17 = &local_d8.key_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.key_._M_dataplus._M_p != paVar17) {
    operator_delete(local_d8.key_._M_dataplus._M_p,local_d8.key_.field_2._M_allocated_capacity + 1);
  }
  ConfigKey::merge_max_files();
  uVar11 = DatabaseConfig::get(&this->config,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.key_._M_dataplus._M_p != paVar17) {
    operator_delete(local_d8.key_._M_dataplus._M_p,local_d8.key_.field_2._M_allocated_capacity + 1);
  }
  local_70 = -0x8000000000000000;
  OnDiskDataset::get_compatible_datasets(&local_60,&this->datasets);
  local_40 = local_60.
             super__Vector_base<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_60.
      super__Vector_base<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_60.
      super__Vector_base<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_100 = (OnDiskDataset **)0x0;
    local_a0 = (OnDiskDataset **)0x0;
    local_108 = (OnDiskDataset **)0x0;
  }
  else {
    local_108 = (OnDiskDataset **)0x0;
    local_a0 = (OnDiskDataset **)0x0;
    local_100 = (OnDiskDataset **)0x0;
    datasets = local_60.
               super__Vector_base<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_48 = uVar11;
    do {
      local_98.super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_38 = datasets;
      if ((char)local_64 == '\0') {
        std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::_M_move_assign
                  (&local_98,datasets);
      }
      else {
        OnDiskDataset::get_compact_candidates
                  ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
                   &local_d8,datasets);
        ppOVar6 = local_98.
                  super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
        ppOVar5 = local_98.
                  super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        local_98.super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)local_d8.key_._M_dataplus._M_p;
        local_98.super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)local_d8.key_._M_string_length;
        local_98.super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)local_d8.key_.field_2._M_allocated_capacity;
        local_d8.key_._M_dataplus._M_p = (pointer)0x0;
        local_d8.key_._M_string_length = 0;
        local_d8.key_.field_2._M_allocated_capacity = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)ppOVar5 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(ppOVar5,(long)ppOVar6 - (long)ppOVar5);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8.key_._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_d8.key_._M_dataplus._M_p,
                          local_d8.key_.field_2._M_allocated_capacity -
                          (long)local_d8.key_._M_dataplus._M_p);
        }
      }
      ppOVar5 = local_98.
                super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      local_f8 = (OnDiskDataset **)0x0;
      iStack_f0._M_current = (OnDiskDataset **)0x0;
      local_e8 = (OnDiskDataset **)0x0;
      for (paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_98.
                        super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          iVar4._M_current = iStack_f0._M_current, ppOVar16 = local_f8,
          paVar17 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ppOVar5;
          paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar17->_M_allocated_capacity + 1)) {
        OnDiskDataset::get_id_abi_cxx11_
                  (&local_d8.key_,(OnDiskDataset *)paVar17->_M_allocated_capacity);
        dataset_id._M_str = local_d8.key_._M_dataplus._M_p;
        dataset_id._M_len = local_d8.key_._M_string_length;
        bVar9 = is_dataset_locked(&this->tasks,dataset_id);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8.key_._M_dataplus._M_p != &local_d8.key_.field_2) {
          operator_delete(local_d8.key_._M_dataplus._M_p,
                          local_d8.key_.field_2._M_allocated_capacity + 1);
        }
        if (!bVar9) {
          if (iStack_f0._M_current == local_e8) {
            std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>::
            _M_realloc_insert<OnDiskDataset_const*const&>
                      ((vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>> *)
                       &local_f8,iStack_f0,(OnDiskDataset **)&paVar17->_M_allocated_capacity);
          }
          else {
            *iStack_f0._M_current = (OnDiskDataset *)paVar17->_M_allocated_capacity;
            iStack_f0._M_current = iStack_f0._M_current + 1;
          }
        }
      }
      uVar15 = 0;
      for (ppOVar18 = local_f8; ppOVar18 != iStack_f0._M_current; ppOVar18 = ppOVar18 + 1) {
        uVar15 = uVar15 + ((*ppOVar18)->files_index).
                          super__Optional_base<OnDiskFileIndex,_false,_false>._M_payload.
                          super__Optional_payload<OnDiskFileIndex,_true,_false,_false>.
                          super__Optional_payload_base<OnDiskFileIndex>._M_payload._M_value.
                          file_count;
      }
      if (local_f8 != iStack_f0._M_current) {
        lVar19 = (long)iStack_f0._M_current - (long)local_f8;
        uVar12 = lVar19 >> 3;
        lVar13 = 0x3f;
        if (uVar12 != 0) {
          for (; uVar12 >> lVar13 == 0; lVar13 = lVar13 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<OnDiskDataset_const**,std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<DatabaseSnapshot::find_compact_candidate[abi:cxx11](bool)const::__0>>
                  (local_f8,iStack_f0._M_current,((uint)lVar13 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar19 < 0x81) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<OnDiskDataset_const**,std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<DatabaseSnapshot::find_compact_candidate[abi:cxx11](bool)const::__0>>
                    (ppOVar16,iVar4._M_current);
        }
        else {
          ppOVar18 = ppOVar16 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<OnDiskDataset_const**,std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<DatabaseSnapshot::find_compact_candidate[abi:cxx11](bool)const::__0>>
                    (ppOVar16,ppOVar18);
          for (; ppOVar18 != iVar4._M_current; ppOVar18 = ppOVar18 + 1) {
            pOVar1 = ppOVar18[-1];
            pOVar2 = *ppOVar18;
            uVar12 = (pOVar2->files_index).super__Optional_base<OnDiskFileIndex,_false,_false>.
                     _M_payload.super__Optional_payload<OnDiskFileIndex,_true,_false,_false>.
                     super__Optional_payload_base<OnDiskFileIndex>._M_payload._M_value.file_count;
            uVar3 = (pOVar1->files_index).super__Optional_base<OnDiskFileIndex,_false,_false>.
                    _M_payload.super__Optional_payload<OnDiskFileIndex,_true,_false,_false>.
                    super__Optional_payload_base<OnDiskFileIndex>._M_payload._M_value.file_count;
            ppOVar16 = ppOVar18;
            while (uVar12 < uVar3) {
              *ppOVar16 = pOVar1;
              pOVar1 = ppOVar16[-2];
              ppOVar16 = ppOVar16 + -1;
              uVar3 = (pOVar1->files_index).super__Optional_base<OnDiskFileIndex,_false,_false>.
                      _M_payload.super__Optional_payload<OnDiskFileIndex,_true,_false,_false>.
                      super__Optional_payload_base<OnDiskFileIndex>._M_payload._M_value.file_count;
            }
            *ppOVar16 = pOVar2;
          }
        }
      }
      ppOVar18 = local_e8;
      ppOVar16 = local_f8;
      uVar12 = (long)iStack_f0._M_current - (long)local_f8 >> 3;
      if ((uVar10 < uVar12) || (local_48 < uVar15)) {
        lVar13 = (long)(iStack_f0._M_current + -1) - (long)local_f8;
        ppOVar8 = iStack_f0._M_current + -1;
        do {
          do {
            iStack_f0._M_current = ppOVar8;
            uVar15 = uVar15 - ((*iStack_f0._M_current)->files_index).
                              super__Optional_base<OnDiskFileIndex,_false,_false>._M_payload.
                              super__Optional_payload<OnDiskFileIndex,_true,_false,_false>.
                              super__Optional_payload_base<OnDiskFileIndex>._M_payload._M_value.
                              file_count;
            uVar12 = lVar13 >> 3;
            lVar13 = lVar13 + -8;
            ppOVar8 = iStack_f0._M_current + -1;
          } while (uVar10 < uVar12);
        } while (local_48 < uVar15);
      }
      iVar4._M_current = iStack_f0._M_current;
      if ((1 < uVar12) && (lVar13 = uVar12 - uVar15 / uVar12, local_70 < lVar13)) {
        local_f8 = (OnDiskDataset **)0x0;
        iStack_f0._M_current = (OnDiskDataset **)0x0;
        local_e8 = (OnDiskDataset **)0x0;
        local_70 = lVar13;
        if (local_108 != (OnDiskDataset **)0x0) {
          operator_delete(local_108,(long)local_100 - (long)local_108);
        }
        local_100 = ppOVar18;
        local_108 = ppOVar16;
        local_a0 = iVar4._M_current;
      }
      pvVar7 = local_38;
      if (local_f8 != (OnDiskDataset **)0x0) {
        operator_delete(local_f8,(long)local_e8 - (long)local_f8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.
             super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
             _M_impl.super__Vector_impl_data._M_start !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_98.
                        super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_98.
                              super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_98.
                              super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      datasets = pvVar7 + 1;
    } while (datasets != local_40);
  }
  std::
  vector<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>
  ::~vector(&local_60);
  ppOVar16 = local_a0;
  if (local_108 == local_a0) {
    plVar14 = spdlog::default_logger_raw();
    this_00 = local_78;
    local_d8.key_._M_dataplus._M_p = (pointer)0x0;
    local_d8.key_._M_string_length = 0;
    local_d8.key_.field_2._M_allocated_capacity = 0;
    loc_00.funcname = (char *)0x0;
    loc_00.filename = (char *)0x0;
    loc_00.line = 0;
    loc_00._12_4_ = 0;
    spdlog::logger::log<char[37],_nullptr>
              (plVar14,loc_00,debug,(char (*) [37])"No suitable compact candidate found.");
  }
  else {
    local_60.
    super__Vector_base<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>,_std::allocator<std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)((long)local_a0 - (long)local_108 >> 3);
    plVar14 = spdlog::default_logger_raw();
    this_00 = local_78;
    local_d8.key_._M_dataplus._M_p = (pointer)0x0;
    local_d8.key_._M_string_length = 0;
    local_d8.key_.field_2._M_allocated_capacity = 0;
    loc.funcname = (char *)0x0;
    loc.filename = (char *)0x0;
    loc.line = 0;
    loc._12_4_ = 0;
    fmt.size_ = 0x28;
    fmt.data_ = "Good candidate (cost: {}, datasets: {}).";
    spdlog::logger::log<long,unsigned_long>
              (plVar14,loc,debug,fmt,&local_70,(unsigned_long *)&local_60);
  }
  *(undefined8 *)this_00 = 0;
  *(undefined8 *)(this_00 + 8) = 0;
  *(undefined8 *)(this_00 + 0x10) = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_00,(long)ppOVar16 - (long)local_108 >> 3);
  if (local_108 != ppOVar16) {
    ppOVar18 = local_108;
    do {
      OnDiskDataset::get_id_abi_cxx11_(&local_d8.key_,*ppOVar18);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(this_00,&local_d8.key_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.key_._M_dataplus._M_p != &local_d8.key_.field_2) {
        operator_delete(local_d8.key_._M_dataplus._M_p,
                        local_d8.key_.field_2._M_allocated_capacity + 1);
      }
      ppOVar18 = ppOVar18 + 1;
    } while (ppOVar18 != ppOVar16);
  }
  if (local_108 != (OnDiskDataset **)0x0) {
    operator_delete(local_108,(long)local_100 - (long)local_108);
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)this_00;
}

Assistant:

std::vector<std::string> DatabaseSnapshot::find_compact_candidate(
    bool smart) const {
    const uint64_t max_datasets = config.get(ConfigKey::merge_max_datasets());
    const uint64_t max_files = config.get(ConfigKey::merge_max_files());

    // Try to find a best compact candidate. As a rating function, we use
    // "number of datasets" - "average number of files", because we want to
    // maximise number of datasets being compacted and minimise number of
    // files being compacted (we want to compact small datasets first).
    std::vector<const OnDiskDataset *> best_compact;
    int64_t best_compact_value = std::numeric_limits<int64_t>::min();
    for (auto &set : OnDiskDataset::get_compatible_datasets(datasets)) {
        // Check every set of compatible datasets.
        std::vector<const OnDiskDataset *> candidates;
        if (smart) {
            // When we're trying to be smart, ignore too small sets.
            candidates = std::move(OnDiskDataset::get_compact_candidates(set));
        } else {
            candidates = std::move(set);
        }

        // Ignore datasets that are locked.
        std::vector<const OnDiskDataset *> ready_candidates;
        for (const auto &candidate : candidates) {
            if (!is_dataset_locked(tasks, candidate->get_id())) {
                ready_candidates.push_back(candidate);
            }
        }

        // Compute number of files in this dataset.
        uint64_t number_of_files = 0;
        for (const auto &candidate : ready_candidates) {
            number_of_files += candidate->get_file_count();
        }

        // Check for allowed maximum merge values. If they are exceeded, try to
        // merge small datasets first.
        std::sort(ready_candidates.begin(), ready_candidates.end(),
                  [](const auto &lhs, const auto &rhs) {
                      return lhs->get_file_count() < rhs->get_file_count();
                  });
        while (ready_candidates.size() > max_datasets ||
               number_of_files > max_files) {
            number_of_files -= ready_candidates.back()->get_file_count();
            ready_candidates.pop_back();
        }

        // It doesn't make sense to merge less than 2 datasets.
        if (ready_candidates.size() < 2) {
            continue;
        }

        // Compute compact_value for this set, and maybe update best candidate.
        uint64_t avg_files = number_of_files / ready_candidates.size();
        int64_t compact_value = ready_candidates.size() - avg_files;
        if (compact_value > best_compact_value) {
            best_compact_value = compact_value;
            best_compact = std::move(ready_candidates);
        }
    }

    if (best_compact.empty()) {
        spdlog::debug("No suitable compact candidate found.");
    } else {
        spdlog::debug("Good candidate (cost: {}, datasets: {}).",
                      best_compact_value, best_compact.size());
    }

    std::vector<std::string> names;
    names.reserve(best_compact.size());
    for (const auto &ds : best_compact) {
        names.emplace_back(ds->get_id());
    }

    return names;
}